

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML88591Transcoder.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XML88591Transcoder::transcodeFrom
          (XML88591Transcoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  byte *pbVar1;
  byte bVar2;
  
  if (srcCount < maxChars) {
    maxChars = srcCount;
  }
  if (0 < (long)maxChars) {
    pbVar1 = srcData + maxChars;
    do {
      bVar2 = *srcData;
      srcData = srcData + 1;
      *toFill = (ushort)bVar2;
      toFill = toFill + 1;
    } while (srcData < pbVar1);
  }
  *bytesEaten = maxChars;
  memset(charSizes,1,maxChars);
  return maxChars;
}

Assistant:

XMLSize_t
XML88591Transcoder::transcodeFrom(  const   XMLByte* const       srcData
                                    , const XMLSize_t            srcCount
                                    ,       XMLCh* const         toFill
                                    , const XMLSize_t            maxChars
                                    ,       XMLSize_t&           bytesEaten
                                    ,       unsigned char* const charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of bytes in the source.
    //
    const XMLSize_t countToDo = srcCount < maxChars ? srcCount : maxChars;

    //
    //  Loop through the bytes to do and convert over each byte. Its just
    //  a cast to the wide char type.
    //
    const XMLByte*  srcPtr = srcData;
    XMLCh*          destPtr = toFill;
    const XMLByte*  srcEnd = srcPtr + countToDo;
    while (srcPtr < srcEnd)
        *destPtr++ = XMLCh(*srcPtr++);

    // Set the bytes eaten, and set the char size array to the fixed size
    bytesEaten = countToDo;
    memset(charSizes, 1, countToDo);

    // Return the chars we transcoded
    return countToDo;
}